

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_classtrait.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseClassTrait
          (Parser *this,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps)

{
  pointer puVar1;
  Token *pTVar2;
  Capabilities *__args_1;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  Token **in_RDX;
  pointer *__ptr;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *err;
  undefined1 local_f8 [32];
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  functions;
  Position local_c0;
  Token **local_a8;
  Token *tokId;
  TemplateDecls templ;
  Position local_78;
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  undefined1 local_48 [16];
  
  puVar1 = *(pointer *)
            ((long)&(caps->_M_t).
                    super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                    .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].required.
                    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
            + 8);
  local_78.line =
       *(size_t *)
        &puVar1[3]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  local_78.startIndex =
       *(size_t *)
        &puVar1[4]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  local_78.endIndex =
       *(size_t *)
        &puVar1[5]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  local_f8._16_8_ = this;
  local_a8 = in_RDX;
  sanityExpect((Parser *)caps,TOK_KW_TRAIT);
  templ.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  templ.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  templ.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar4 = Token::operator==(*(Token **)
                             ((long)&(caps->_M_t).
                                     super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                     .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                     _M_head_impl[3].required.
                                     super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                             + 8),TOK_OP_TEMPL_BRACKET_OPEN);
  if (bVar4) {
    parseTemplateDecl((TemplateDecls *)&functions,(Parser *)caps);
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::_M_move_assign(&templ,&functions);
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
               *)&functions);
  }
  pTVar2 = *(Token **)
            ((long)&(caps->_M_t).
                    super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                    .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].required.
                    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
            + 8);
  tokId = pTVar2;
  bVar4 = expect((Parser *)caps,TOK_ID);
  bVar4 = !bVar4;
  if (bVar4) {
    local_f8._0_2_ = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
    local_c0.line._0_4_ = 8;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&functions,(SyntaxErrorCode *)local_f8,&local_c0);
    generateError((Parser *)&stack0xffffffffffffffc8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)caps);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffc8);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&functions);
  }
  bVar5 = expect((Parser *)caps,TOK_OP_DCL);
  if (!bVar5) {
    local_f8._0_2_ = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
    local_c0.line._0_4_ = 8;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&functions,(SyntaxErrorCode *)local_f8,&local_c0);
    generateError((Parser *)(local_48 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)caps);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_48 + 8));
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&functions);
  }
  parseExpression((Parser *)local_f8,(Precedence)caps);
  if ((Expr *)CONCAT62(local_f8._2_6_,local_f8._0_2_) == (Expr *)0x0) {
    bVar4 = true;
  }
  else {
    bVar5 = isBiOpExpr((Expr *)CONCAT62(local_f8._2_6_,local_f8._0_2_),TOK_OP_COMMA);
    if (bVar5) {
      local_f8._8_2_ = 2;
      local_c0.line._0_4_ = 0x1a;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&functions,(SyntaxErrorCode *)(local_f8 + 8),&local_c0);
      generateError((Parser *)local_48,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)caps);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_48);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)&functions);
    }
  }
  err = (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)0x1;
  bVar5 = expect((Parser *)caps,TOK_EOL);
  if (!bVar5) {
    local_f8._8_2_ = 2;
    local_c0.line._0_4_ = 0xf;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&functions,(SyntaxErrorCode *)(local_f8 + 8),&local_c0);
    err = caps;
    generateError((Parser *)local_50,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)caps);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_50)
    ;
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&functions);
  }
  functions.
  super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&functions;
  functions.
  super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ._M_impl._M_node._M_size = 0;
  functions.
  super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       functions.
       super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  parseClassTraitBody((Parser *)caps,(bool *)err,
                      (list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                       *)functions.
                         super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                         ._M_impl._M_node.super__List_node_base._M_next);
  bVar5 = expect((Parser *)caps,TOK_STMT);
  if (!bVar5) {
    local_f8._30_2_ = 2;
    local_f8._8_4_ = 0xc;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&local_c0,(SyntaxErrorCode *)(local_f8 + 0x1e),(Position *)(local_f8 + 8));
    generateError((Parser *)local_58,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)caps);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_58)
    ;
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&local_c0);
  }
  if (bVar4) {
    *(Lexer **)local_f8._16_8_ = (Lexer *)0x0;
  }
  else {
    __args_1 = (caps->_M_t).
               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
               ._M_t.
               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
    Position::operator+(&local_78,&pTVar2->pos);
    std::
    make_unique<pfederc::TraitImplExpr,pfederc::Lexer&,pfederc::Position,std::unique_ptr<pfederc::Capabilities,std::default_delete<pfederc::Capabilities>>,pfederc::Token_const*const&,std::vector<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>,std::allocator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::__cxx11::list<std::unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>>,std::allocator<std::unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>>>>>
              ((Lexer *)(local_f8 + 8),(Position *)__args_1,
               (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
               &local_c0,local_a8,
               (vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                *)&tokId,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&templ,
               (list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                *)local_f8);
    uVar3 = local_f8._8_8_;
    local_f8._8_8_ = (Lexer *)0x0;
    *(Lexer **)local_f8._16_8_ = (Lexer *)uVar3;
    std::unique_ptr<pfederc::TraitImplExpr,_std::default_delete<pfederc::TraitImplExpr>_>::
    ~unique_ptr((unique_ptr<pfederc::TraitImplExpr,_std::default_delete<pfederc::TraitImplExpr>_> *)
                (local_f8 + 8));
  }
  std::__cxx11::
  _List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ::_M_clear(&functions.
              super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
            );
  if ((long *)CONCAT62(local_f8._2_6_,local_f8._0_2_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT62(local_f8._2_6_,local_f8._0_2_) + 8))();
  }
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::~vector(&templ);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_f8._16_8_;
}

Assistant:

std::unique_ptr<Expr> Parser::parseClassTrait(std::unique_ptr<Capabilities> &&caps) noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_KW_TRAIT);

  // hard errors
  bool err = false;

  TemplateDecls templ;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_TEMPL_BRACKET_OPEN) {
    templ = parseTemplateDecl();
  }

  const Token *const tokId = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_ID, tokId->getPosition()));
    err = true;
  }

  if (!expect(TokenType::TOK_OP_DCL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_ID, lexer.getCurrentToken()->getPosition()));
  }

  std::unique_ptr<Expr> impltrait(parseExpression());
  if (!impltrait)
    err = true;
  else if (isBiOpExpr(*impltrait, TokenType::TOK_OP_COMMA)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_TRAITCLASS_IMPL, impltrait->getPosition()));
  }

  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
  }

  std::list<std::unique_ptr<FuncExpr>> functions;
  parseClassTraitBody(err, functions);

  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition()));
  }

  if (err)
    return nullptr;

  return std::make_unique<TraitImplExpr>(lexer,
      pos + tokId->getPosition(), std::move(caps),
      tokId, std::move(templ), std::move(impltrait), std::move(functions));
}